

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

pair<unsigned_long,_bool>
detail::
try_get_range_size<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
          (span<const_std::byte> buffer)

{
  ulong uVar1;
  byte *pbVar2;
  undefined8 in_RDX;
  undefined8 uVar3;
  pair<unsigned_long,_bool> pVar4;
  
  pbVar2 = buffer.begin_;
  uVar1 = (long)buffer.end_ - (long)pbVar2;
  if ((long)uVar1 < 0) {
LAB_00103dd4:
    __assert_fail("diff >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/src/include/span.hpp"
                  ,0x22,"size_t span<const std::byte>::size() const [T = const std::byte]");
  }
  if (7 < uVar1) {
    uVar1 = (long)buffer.end_ - (long)(pbVar2 + 8);
    if ((long)uVar1 < 0) goto LAB_00103dd4;
    if ((ulong)(*(undefined8 *)pbVar2 * 8) <= uVar1) {
      pbVar2 = pbVar2 + 8 + (*(undefined8 *)pbVar2 * 8 - (long)pbVar2);
      uVar3 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
      goto LAB_00103dd2;
    }
  }
  pbVar2 = (byte *)0x0;
  uVar3 = 0;
LAB_00103dd2:
  pVar4._8_8_ = uVar3;
  pVar4.first = (unsigned_long)pbVar2;
  return pVar4;
}

Assistant:

std::pair<size_t, bool> try_get_range_size(span<std::byte const> buffer) noexcept {
        auto const data_begin = buffer.begin();

        size_t count;
        if (buffer.size() < sizeof(count)) return { {}, false };
        deserialize(count, buffer);
        
        using value_type = typename range_traits<T>::value_type;
        if constexpr (serialization_category_v<value_type> == serialization_category::trivial) {
            auto const elements_size = count * sizeof(value_type);
            if (buffer.size() < elements_size) return { {}, false };
            buffer.begin() += elements_size;
        }
        else {
            for (size_t i = 0; i < count; ++i) {
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return { {}, false };
                buffer.begin() += size;
            }
        }
        return { buffer.begin() - data_begin, true };
    }